

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

parser_error parse_owner(parser *p)

{
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  char *name;
  char *pcVar4;
  int *piVar5;
  player_race *ppVar6;
  int iVar7;
  parser_error pVar8;
  
  pvVar3 = parser_priv(p);
  uVar2 = parser_getuint(p,"purse");
  name = parser_getsym(p,"race");
  pcVar4 = parser_getstr(p,"name");
  pcVar4 = string_make(pcVar4);
  if (pvVar3 == (void *)0x0) {
    pVar8 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    piVar5 = (int *)mem_zalloc(0x28);
    piVar1 = *(int **)((long)pvVar3 + 8);
    pVar8 = PARSE_ERROR_NONE;
    iVar7 = 0;
    if (piVar1 != (int *)0x0) {
      iVar7 = *piVar1 + 1;
    }
    *piVar5 = iVar7;
    *(int **)(piVar5 + 2) = piVar1;
    *(char **)(piVar5 + 4) = pcVar4;
    ppVar6 = player_race_from_name(name);
    *(player_race **)(piVar5 + 6) = ppVar6;
    piVar5[8] = uVar2;
    *(int **)((long)pvVar3 + 8) = piVar5;
  }
  return pVar8;
}

Assistant:

static enum parser_error parse_owner(struct parser *p) {
	struct store *s = parser_priv(p);
	unsigned int maxcost = parser_getuint(p, "purse");
	const char *race = parser_getsym(p, "race");
	char *name = string_make(parser_getstr(p, "name"));
	struct owner *o;

	if (!s)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	o = mem_zalloc(sizeof *o);
	o->oidx = (s->owners ? s->owners->oidx + 1 : 0);
	o->next = s->owners;
	o->name = name;
	o->race = player_race_from_name(race);
	o->max_cost = maxcost;
	s->owners = o;
	return PARSE_ERROR_NONE;
}